

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxseparate.cpp
# Opt level: O2

int32_t main(int32_t argc,char **argv)

{
  char *__haystack;
  char *pcVar1;
  ogt_vox_scene *_scene;
  char *pcVar2;
  size_t sVar3;
  int32_t iVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ogt_vox_model *model;
  ogt_vox_layer local_49b8;
  ogt_vox_instance local_49a8;
  char tmp_model_name [64];
  ogt_vox_group local_48e8;
  char output_filename [1024];
  ogt_vox_scene local_4478;
  
  if (argc < 2) {
    puts("ERROR: no input files were provided on the command-line");
    print_help();
    iVar4 = 3;
  }
  else {
    local_49b8.color.r = '\0';
    local_49b8.color.g = '\0';
    local_49b8.color.b = '\0';
    local_49b8.color.a = '\0';
    local_49b8.hidden = false;
    local_49b8._13_3_ = 0;
    local_49b8.name = "default";
    local_48e8.name = (char *)0x0;
    local_48e8.layer_index = 0;
    local_48e8.hidden = false;
    local_48e8._81_7_ = 0;
    local_48e8.transform_anim.keyframes = (ogt_vox_keyframe_transform *)0x0;
    local_48e8.transform.m12 = 0.0;
    local_48e8.transform.m13 = 0.0;
    local_48e8.transform.m20 = 0.0;
    local_48e8.transform.m21 = 0.0;
    local_48e8.transform_anim.num_keyframes = 0;
    local_48e8.transform_anim.loop = false;
    local_48e8.transform_anim._13_3_ = 0;
    local_48e8.transform.m00 = 1.0;
    local_48e8.transform.m01 = 0.0;
    local_48e8.transform.m02 = 0.0;
    local_48e8.transform.m03 = 0.0;
    local_48e8.transform.m10 = 0.0;
    local_48e8.transform.m11 = 1.0;
    local_48e8.transform.m22 = 1.0;
    local_48e8.transform.m23 = 0.0;
    local_48e8.transform.m30 = 0.0;
    local_48e8.transform.m31 = 0.0;
    local_48e8.transform.m32 = 0.0;
    local_48e8.transform.m33 = 1.0;
    local_48e8.parent_group_index = 0xffffffff;
    for (uVar9 = 1; iVar4 = 0, uVar9 != (uint)argc; uVar9 = uVar9 + 1) {
      __haystack = argv[uVar9];
      pcVar1 = strstr(__haystack,".vox");
      if (pcVar1 == (char *)0x0) {
        iVar4 = 4;
        pcVar1 = "ERROR: input \'%s\' specified does not have .vox extension.\n";
LAB_0010896d:
        printf(pcVar1,__haystack);
        return iVar4;
      }
      printf("processing input %s\n");
      _scene = load_vox_scene(__haystack,0);
      if (_scene == (ogt_vox_scene *)0x0) {
        pcVar1 = "ERROR: could not load scene with name \'%s\'\n";
        iVar4 = 5;
        goto LAB_0010896d;
      }
      for (uVar6 = 0; uVar6 < _scene->num_models; uVar6 = uVar6 + 1) {
        model = _scene->models[uVar6];
        lVar8 = 0;
        pcVar1 = (char *)0x0;
        for (uVar7 = 0; uVar7 < _scene->num_instances; uVar7 = uVar7 + 1) {
          pcVar2 = *(char **)((long)&_scene->instances->name + lVar8);
          pcVar5 = pcVar1;
          if (((pcVar2 != (char *)0x0) &&
              (uVar6 == *(uint *)((long)&_scene->instances->model_index + lVar8))) &&
             (pcVar5 = pcVar2, pcVar1 != (char *)0x0)) {
            printf("WARNING: model %i has been given name %s but there is also an instance of this model with name %s."
                   ,uVar6 & 0xffffffff,pcVar1);
            pcVar5 = pcVar1;
          }
          lVar8 = lVar8 + 0x78;
          pcVar1 = pcVar5;
        }
        tmp_model_name[0x30] = '\0';
        tmp_model_name[0x31] = '\0';
        tmp_model_name[0x32] = '\0';
        tmp_model_name[0x33] = '\0';
        tmp_model_name[0x34] = '\0';
        tmp_model_name[0x35] = '\0';
        tmp_model_name[0x36] = '\0';
        tmp_model_name[0x37] = '\0';
        tmp_model_name[0x38] = '\0';
        tmp_model_name[0x39] = '\0';
        tmp_model_name[0x3a] = '\0';
        tmp_model_name[0x3b] = '\0';
        tmp_model_name[0x3c] = '\0';
        tmp_model_name[0x3d] = '\0';
        tmp_model_name[0x3e] = '\0';
        tmp_model_name[0x3f] = '\0';
        tmp_model_name[0x20] = '\0';
        tmp_model_name[0x21] = '\0';
        tmp_model_name[0x22] = '\0';
        tmp_model_name[0x23] = '\0';
        tmp_model_name[0x24] = '\0';
        tmp_model_name[0x25] = '\0';
        tmp_model_name[0x26] = '\0';
        tmp_model_name[0x27] = '\0';
        tmp_model_name[0x28] = '\0';
        tmp_model_name[0x29] = '\0';
        tmp_model_name[0x2a] = '\0';
        tmp_model_name[0x2b] = '\0';
        tmp_model_name[0x2c] = '\0';
        tmp_model_name[0x2d] = '\0';
        tmp_model_name[0x2e] = '\0';
        tmp_model_name[0x2f] = '\0';
        tmp_model_name[0x10] = '\0';
        tmp_model_name[0x11] = '\0';
        tmp_model_name[0x12] = '\0';
        tmp_model_name[0x13] = '\0';
        tmp_model_name[0x14] = '\0';
        tmp_model_name[0x15] = '\0';
        tmp_model_name[0x16] = '\0';
        tmp_model_name[0x17] = '\0';
        tmp_model_name[0x18] = '\0';
        tmp_model_name[0x19] = '\0';
        tmp_model_name[0x1a] = '\0';
        tmp_model_name[0x1b] = '\0';
        tmp_model_name[0x1c] = '\0';
        tmp_model_name[0x1d] = '\0';
        tmp_model_name[0x1e] = '\0';
        tmp_model_name[0x1f] = '\0';
        tmp_model_name[0] = '\0';
        tmp_model_name[1] = '\0';
        tmp_model_name[2] = '\0';
        tmp_model_name[3] = '\0';
        tmp_model_name[4] = '\0';
        tmp_model_name[5] = '\0';
        tmp_model_name[6] = '\0';
        tmp_model_name[7] = '\0';
        tmp_model_name[8] = '\0';
        tmp_model_name[9] = '\0';
        tmp_model_name[10] = '\0';
        tmp_model_name[0xb] = '\0';
        tmp_model_name[0xc] = '\0';
        tmp_model_name[0xd] = '\0';
        tmp_model_name[0xe] = '\0';
        tmp_model_name[0xf] = '\0';
        if (pcVar1 == (char *)0x0) {
          pcVar1 = tmp_model_name;
          sprintf(pcVar1,"model%i",uVar6 & 0xffffffff);
        }
        local_49a8.transform_anim.num_keyframes = 0;
        local_49a8.transform_anim.loop = false;
        local_49a8.transform_anim._13_3_ = 0;
        local_49a8.model_anim.keyframes = (ogt_vox_keyframe_model *)0x0;
        local_49a8.group_index = 0;
        local_49a8.hidden = false;
        local_49a8._85_3_ = 0;
        local_49a8.transform_anim.keyframes = (ogt_vox_keyframe_transform *)0x0;
        local_49a8.model_index = 0;
        local_49a8.layer_index = 0;
        local_49a8.model_anim.num_keyframes = 0;
        local_49a8.model_anim.loop = false;
        local_49a8.model_anim._13_3_ = 0;
        local_49a8.name = (char *)0x0;
        local_49a8.transform.m12 = 0.0;
        local_49a8.transform.m13 = 0.0;
        local_49a8.transform.m20 = 0.0;
        local_49a8.transform.m21 = 0.0;
        local_49a8.transform.m00 = 1.0;
        local_49a8.transform.m01 = 0.0;
        local_49a8.transform.m02 = 0.0;
        local_49a8.transform.m03 = 0.0;
        local_49a8.transform.m10 = 0.0;
        local_49a8.transform.m11 = 1.0;
        local_49a8.transform.m22 = 1.0;
        local_49a8.transform.m23 = 0.0;
        local_49a8.transform.m30 = 0.0;
        local_49a8.transform.m31 = 0.0;
        local_49a8.transform.m32 = 0.0;
        local_49a8.transform.m33 = 1.0;
        memset(&local_4478.materials,0,0x4010);
        local_4478.groups = &local_48e8;
        local_4478.instances = &local_49a8;
        local_4478.layers = &local_49b8;
        local_4478.num_models = 1;
        local_4478.num_instances = 1;
        local_4478.num_layers = 1;
        local_4478.num_groups = 1;
        local_4478.models = &model;
        memcpy(&local_4478.palette,&_scene->palette,0x400);
        strcpy(output_filename,__haystack);
        pcVar2 = strchr(output_filename,0x2e);
        *pcVar2 = '\0';
        sVar3 = strlen(output_filename);
        (output_filename + sVar3)[0] = '-';
        (output_filename + sVar3)[1] = '\0';
        strcat(output_filename,pcVar1);
        sVar3 = strlen(output_filename);
        builtin_strncpy(output_filename + sVar3,".vox",5);
        save_vox_scene(output_filename,&local_4478);
      }
      ogt_vox_destroy_scene(_scene);
    }
  }
  return iVar4;
}

Assistant:

int32_t main(int32_t argc, char** argv) {
    // validate we have at least one input file provided on command-line.
    if (argc <= 1) {
        printf("ERROR: no input files were provided on the command-line\n");
        print_help();
        return 3;
    }

    ogt_vox_layer default_layer = {};
    default_layer.hidden = false;
    default_layer.name = "default";

    ogt_vox_group default_group = {};
    default_group.hidden = false;
    default_group.layer_index = 0;
    default_group.parent_group_index = k_invalid_group_index;
    default_group.transform = ogt_vox_transform_get_identity();

    // process all input files specified
    for (int32_t input_index = 1; input_index < argc; input_index++) {
        const char* input_filename = argv[input_index];
        if (!strstr(input_filename, ".vox")) {
            printf("ERROR: input '%s' specified does not have .vox extension.\n", input_filename);
            return 4;
        }
        printf("processing input %s\n", input_filename);

        // load scene
        const ogt_vox_scene* scene = load_vox_scene(input_filename);
        if (!scene) {
            printf("ERROR: could not load scene with name '%s'\n", input_filename);
            return 5;
        }

        // determine which models we're going to write to the FBX file.
        for (uint32_t model_index = 0; model_index < scene->num_models; model_index++) {
            const ogt_vox_model* model = scene->models[model_index];

            // find the model name by finding a named instance that references it.
            const char* model_name = NULL;
            for (uint32_t instance_index = 0; instance_index < scene->num_instances; instance_index++) {
                if (scene->instances[instance_index].name && scene->instances[instance_index].model_index == model_index) {
                    if (!model_name) {
                        model_name = scene->instances[instance_index].name;
                    }
                    else {
                        // warn if there are multiple instances of the same model with different names causing ambiguity (a .vox author could do this without knowing).
                        printf("WARNING: model %i has been given name %s but there is also an instance of this model with name %s.", model_index, model_name, scene->instances[instance_index].name);
                    }
                }
            }

            // if there is no model name, we either skip the export of this model (if --named-models-only was specified ) or give it an autogenerated name
            char tmp_model_name[64] = {};
            if (!model_name) {
                // otherwise, autogenerate a name for the model based on its index in the vox file.
                model_name = tmp_model_name;
                sprintf_s(tmp_model_name, "model%i", model_index);
            }

            // construct the scene with a single instance referencing this model
            ogt_vox_instance instance = {};
            instance.group_index = 0;   // default_group
            instance.hidden      = false;
            instance.layer_index = 0;   // default_layer
            instance.model_index = 0;
            instance.name        = NULL;
            instance.transform   = ogt_vox_transform_get_identity();

            ogt_vox_scene output_scene = {};
            output_scene.groups        = &default_group;
            output_scene.num_groups    = 1;
            output_scene.instances     = &instance;
            output_scene.num_instances = 1;
            output_scene.instances     = &instance;
            output_scene.num_layers    = 1;
            output_scene.layers        = &default_layer;
            output_scene.num_models    = 1;
            output_scene.models        = &model;
            output_scene.palette       = scene->palette;

            // construct the output filename for this model.
            char output_filename[1024];
            strcpy_s(output_filename, input_filename);
            char* ext = strstr(output_filename, ".");
            *ext = 0;
            strcat_s(output_filename, "-");
            strcat_s(output_filename, model_name);
            strcat_s(output_filename, ".vox");

            save_vox_scene(output_filename, &output_scene);
        }

        ogt_vox_destroy_scene(scene);
    }

    return 0;
}